

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

int Fra_ImpVerifyUsingSimulation(Fra_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Fra_Sml_t *p_00;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  
  pVVar6 = p->pCla->vImps;
  iVar2 = 0;
  if ((pVVar6 != (Vec_Int_t *)0x0) && (iVar2 = 0, pVVar6->nSize != 0)) {
    p_00 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,2000,8,1);
    pVVar6 = p->pCla->vImps;
    uVar1 = pVVar6->nSize;
    __ptr = calloc(1,(long)(int)uVar1);
    for (lVar5 = 0; lVar5 < (int)uVar1; lVar5 = lVar5 + 1) {
      uVar1 = Vec_IntEntry(pVVar6,(int)lVar5);
      iVar2 = Sml_NodeCheckImp(p_00,uVar1 & 0xffff,(int)uVar1 >> 0x10);
      *(byte *)((long)__ptr + lVar5) = (byte)iVar2 ^ 1;
      pVVar6 = p->pCla->vImps;
      uVar1 = pVVar6->nSize;
    }
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    iVar2 = 0;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = iVar2 + *(char *)((long)__ptr + uVar3);
    }
    free(__ptr);
    Fra_SmlStop(p_00);
  }
  return iVar2;
}

Assistant:

int Fra_ImpVerifyUsingSimulation( Fra_Man_t * p )
{
    int nFrames = 2000;
    int nSimWords = 8;
    Fra_Sml_t * pSeq;
    char * pfFails;
    int Left, Right, Imp, i, Counter;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return 0;
    // simulate the AIG manager with combinational patterns
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nFrames, nSimWords, 1  );
    // go through the implications and check how many of them do not hold
    pfFails = ABC_ALLOC( char, Vec_IntSize(p->pCla->vImps) );
    memset( pfFails, 0, sizeof(char) * Vec_IntSize(p->pCla->vImps) );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        pfFails[i] = !Sml_NodeCheckImp( pSeq, Left, Right );
    }
    // count how many has failed
    Counter = 0;
    for ( i = 0; i < Vec_IntSize(p->pCla->vImps); i++ )
        Counter += pfFails[i];
    ABC_FREE( pfFails );
    Fra_SmlStop( pSeq );
    return Counter;
}